

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_runtime.cpp
# Opt level: O0

void __thiscall MppRuntimeService::MppRuntimeService(MppRuntimeService *this)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  byte local_149;
  size_t len;
  FILE *fp;
  RK_S32 val;
  int f_ok;
  RK_U32 dev_path_len;
  RK_U32 allocator_found;
  char *p;
  RK_U32 dts_path_len;
  RK_U32 path_len;
  char path [256];
  RK_U32 j;
  RK_U32 i;
  MppRuntimeService *this_local;
  
  mpp_env_get_u32("mpp_rt_debug",&mpp_rt_debug,0);
  this->allocator_valid[0] = 1;
  iVar1 = access("/dev/ion",6);
  this->allocator_valid[1] = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  iVar1 = access("/dev/dri/renderD128",6);
  local_149 = 1;
  if (iVar1 != 0) {
    iVar1 = access("/dev/dri/card0",6);
    local_149 = iVar1 != 0 ^ 0xff;
  }
  this->allocator_valid[3] = (uint)(local_149 & 1);
  iVar1 = access("/dev/dma_heap",4);
  this->allocator_valid[4] = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  if (((this->allocator_valid[1] == 0) && (this->allocator_valid[3] == 0)) &&
     (this->allocator_valid[4] == 0)) {
    _mpp_log_l(2,"mpp_rt","can NOT found any allocator\n",(char *)0x0);
  }
  else if (this->allocator_valid[4] == 0) {
    if ((this->allocator_valid[1] == 0) || (this->allocator_valid[3] != 0)) {
      if ((this->allocator_valid[1] == 0) && (this->allocator_valid[3] != 0)) {
        if (mpp_rt_debug != 0) {
          _mpp_log_l(4,"mpp_rt","use drm allocator\n",(char *)0x0);
        }
      }
      else {
        iVar1 = access("/dev/mpp_service",6);
        if (iVar1 == 0) {
          this->allocator_valid[1] = 0;
          if (mpp_rt_debug != 0) {
            _mpp_log_l(4,"mpp_rt","use drm allocator for mpp_service\n",(char *)0x0);
          }
        }
        else if ((this->allocator_valid[1] != 0) && (this->allocator_valid[3] != 0)) {
          p._4_4_ = 0xff;
          p._0_4_ = snprintf((char *)&dts_path_len,0xff,"%s",mpp_dts_base);
          _dev_path_len = (char *)((long)&dts_path_len + (ulong)(uint)p);
          f_ok = 0;
          p._4_4_ = p._4_4_ - (uint)p;
          path[0xfc] = '\0';
          path[0xfd] = '\0';
          path[0xfe] = '\0';
          path[0xff] = '\0';
          for (; (uint)path._252_4_ < 3; path._252_4_ = path._252_4_ + 1) {
            path[0xf8] = '\0';
            path[0xf9] = '\0';
            path[0xfa] = '\0';
            path[0xfb] = '\0';
            for (; (uint)path._248_4_ < 7; path._248_4_ = path._248_4_ + 1) {
              val = snprintf(_dev_path_len,(ulong)p._4_4_,"%s%s",mpp_vpu_names[(uint)path._252_4_],
                             mpp_vpu_address[(uint)path._248_4_]);
              fp._4_4_ = access((char *)&dts_path_len,0);
              if (fp._4_4_ == 0) {
                snprintf(_dev_path_len + (uint)val,(ulong)(p._4_4_ - val),"/%s","allocator");
                fp._4_4_ = access((char *)&dts_path_len,0);
                if (fp._4_4_ == 0) {
                  fp._0_4_ = 0;
                  __stream = fopen((char *)&dts_path_len,"rb");
                  if (__stream != (FILE *)0x0) {
                    sVar2 = fread(&fp,1,4,__stream);
                    if (sVar2 != 4) {
                      _mpp_log_l(2,"mpp_rt","failed to read dts allocator value default 0\n",
                                 (char *)0x0);
                      fp._0_4_ = 0;
                    }
                    if ((int)fp == 0) {
                      this->allocator_valid[3] = 0;
                      if (mpp_rt_debug != 0) {
                        _mpp_log_l(4,"mpp_rt","found ion allocator in dts\n",(char *)0x0);
                      }
                    }
                    else {
                      this->allocator_valid[1] = 0;
                      if (mpp_rt_debug != 0) {
                        _mpp_log_l(4,"mpp_rt","found drm allocator in dts\n",(char *)0x0);
                      }
                    }
                    f_ok = 1;
                  }
                }
              }
              if (f_ok != 0) break;
            }
            if (f_ok != 0) break;
          }
          if (f_ok == 0) {
            _mpp_log_l(4,"mpp_rt","Can NOT found allocator in dts, enable both ion and drm\n",
                       (char *)0x0);
          }
        }
      }
    }
    else if (mpp_rt_debug != 0) {
      _mpp_log_l(4,"mpp_rt","use ion allocator\n",(char *)0x0);
    }
  }
  else if (mpp_rt_debug != 0) {
    _mpp_log_l(4,"mpp_rt","use dma heap allocator\n",(char *)0x0);
  }
  return;
}

Assistant:

MppRuntimeService::MppRuntimeService()
{
    mpp_env_get_u32("mpp_rt_debug", &mpp_rt_debug, 0);

    allocator_valid[MPP_BUFFER_TYPE_NORMAL] = 1;
    allocator_valid[MPP_BUFFER_TYPE_ION] = !access("/dev/ion", F_OK | R_OK | W_OK);
    allocator_valid[MPP_BUFFER_TYPE_DRM] =
        !access("/dev/dri/renderD128", F_OK | R_OK | W_OK) ||
        !access("/dev/dri/card0", F_OK | R_OK | W_OK);
    allocator_valid[MPP_BUFFER_TYPE_DMA_HEAP] = !access("/dev/dma_heap", F_OK | R_OK);

    if (!allocator_valid[MPP_BUFFER_TYPE_ION] &&
        !allocator_valid[MPP_BUFFER_TYPE_DRM] &&
        !allocator_valid[MPP_BUFFER_TYPE_DMA_HEAP]) {
        mpp_err("can NOT found any allocator\n");
        return;
    }

    if (allocator_valid[MPP_BUFFER_TYPE_DMA_HEAP]) {
        mpp_rt_dbg("use dma heap allocator\n");
        return;
    }

    if (allocator_valid[MPP_BUFFER_TYPE_ION] && !allocator_valid[MPP_BUFFER_TYPE_DRM]) {
        mpp_rt_dbg("use ion allocator\n");
        return;
    }

    if (!allocator_valid[MPP_BUFFER_TYPE_ION] && allocator_valid[MPP_BUFFER_TYPE_DRM]) {
        mpp_rt_dbg("use drm allocator\n");
        return;
    }

    if (!access("/dev/mpp_service", F_OK | R_OK | W_OK)) {
        allocator_valid[MPP_BUFFER_TYPE_ION] = 0;

        mpp_rt_dbg("use drm allocator for mpp_service\n");
        return;
    }

    // If both ion and drm is enabled detect allocator in dts to choose one
    // TODO: When unify dma fd kernel is completed this part will be removed.
    if (allocator_valid[MPP_BUFFER_TYPE_ION] &&
        allocator_valid[MPP_BUFFER_TYPE_DRM]) {
        /* Detect hardware buffer type is ion or drm */
        RK_U32 i, j;
        char path[MAX_DTS_PATH_LEN];
        RK_U32 path_len = MAX_DTS_PATH_LEN - 1;
        RK_U32 dts_path_len = snprintf(path, path_len, "%s", mpp_dts_base);
        char *p = path + dts_path_len;
        RK_U32 allocator_found = 0;

        path_len -= dts_path_len;

        for (i = 0; i < MPP_ARRAY_ELEMS(mpp_vpu_names); i++) {
            for (j = 0; j < MPP_ARRAY_ELEMS(mpp_vpu_address); j++) {
                RK_U32 dev_path_len = snprintf(p, path_len, "%s%s",
                                               mpp_vpu_names[i], mpp_vpu_address[j]);
                int f_ok = access(path, F_OK);
                if (f_ok == 0) {
                    snprintf(p + dev_path_len, path_len - dev_path_len, "/%s", "allocator");
                    f_ok = access(path, F_OK);
                    if (f_ok == 0) {
                        RK_S32 val = 0;
                        FILE *fp = fopen(path, "rb");
                        if (fp) {
                            size_t len = fread(&val, 1, 4, fp);
                            // zero for ion non-zero for drm ->
                            // zero     - disable drm
                            // non-zero - disable ion
                            if (len != 4) {
                                mpp_err("failed to read dts allocator value default 0\n");
                                val = 0;
                            }

                            if (val == 0) {
                                allocator_valid[MPP_BUFFER_TYPE_DRM] = 0;
                                mpp_rt_dbg("found ion allocator in dts\n");
                            } else {
                                allocator_valid[MPP_BUFFER_TYPE_ION] = 0;
                                mpp_rt_dbg("found drm allocator in dts\n");
                            }
                            allocator_found = 1;
                        }
                    }
                }
                if (allocator_found)
                    break;
            }
            if (allocator_found)
                break;
        }

        if (!allocator_found)
            mpp_log("Can NOT found allocator in dts, enable both ion and drm\n");
    }
}